

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScopeGuard.cc
# Opt level: O2

void dismiss_test(void)

{
  int iVar1;
  UnitTest *pUVar2;
  ostream *poVar3;
  undefined8 uVar4;
  bool flag;
  allocator local_51;
  ScopeGuard s;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._M_unused._M_object = &flag;
  flag = true;
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/lucklove[P]ZBase/test/ScopeGuard.cc:44:22)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/lucklove[P]ZBase/test/ScopeGuard.cc:44:22)>
             ::_M_manager;
  ScopeGuard::ScopeGuard(&s,(function<void_()> *)&local_28);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  s.dismissed_ = true;
  ScopeGuard::~ScopeGuard(&s);
  pUVar2 = UnitTest::getInstance();
  iVar1 = (*pUVar2->current_case_->_vptr_BaseCase[2])();
  if ((char)iVar1 == '\0') {
    pUVar2 = UnitTest::getInstance();
    std::__cxx11::string::string
              ((string *)&s,
               "/workspace/llm4binary/github/license_c_cmakelists/lucklove[P]ZBase/test/ScopeGuard.cc"
               ,&local_51);
    std::__cxx11::string::_M_assign((string *)&pUVar2->last_checked_file_);
    std::__cxx11::string::~string((string *)&s);
    pUVar2 = UnitTest::getInstance();
    pUVar2->last_checked_line_ = 0x2f;
    if (flag == false) {
      pUVar2 = UnitTest::getInstance();
      pUVar2->failure_num_ = pUVar2->failure_num_ + 1;
      poVar3 = std::operator<<((ostream *)&std::cout,">>> check \"");
      poVar3 = std::operator<<(poVar3,"flag");
      poVar3 = std::operator<<(poVar3,"\" failed.");
      poVar3 = std::operator<<(poVar3,"at ");
      poVar3 = std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/lucklove[P]ZBase/test/ScopeGuard.cc"
                              );
      poVar3 = std::operator<<(poVar3,"(");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x2f);
      poVar3 = std::operator<<(poVar3,")");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    return;
  }
  uVar4 = __cxa_allocate_exception(1);
  __cxa_throw(uVar4,&AbortThisCase::typeinfo,0);
}

Assistant:

TEST_CASE(dismiss_test)
{
    bool flag = true;
    {
        ScopeGuard s{[&]{ flag = false; }};
        s.dismiss();
    }
    TEST_CHECK(flag);
}